

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

pthread_t * start_thread(gpioThreadFunc_t *thread_func,void *arg)

{
  int iVar1;
  void *in_RSI;
  __start_routine *in_RDI;
  pthread_attr_t pthAttr;
  pthread_t *pth;
  pthread_attr_t pStack_58;
  pthread_t *local_20;
  void *local_18;
  __start_routine *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = (pthread_t *)malloc(8);
  if (local_20 != (pthread_t *)0x0) {
    iVar1 = pthread_attr_init(&pStack_58);
    if (iVar1 != 0) {
      perror("pthread_attr_init failed");
      free(local_20);
      return (pthread_t *)0x0;
    }
    iVar1 = pthread_attr_setstacksize(&pStack_58,0x40000);
    if (iVar1 != 0) {
      perror("pthread_attr_setstacksize failed");
      free(local_20);
      return (pthread_t *)0x0;
    }
    iVar1 = pthread_create(local_20,&pStack_58,local_10,local_18);
    if (iVar1 != 0) {
      perror("pthread_create socket failed");
      free(local_20);
      return (pthread_t *)0x0;
    }
  }
  return local_20;
}

Assistant:

pthread_t *start_thread(gpioThreadFunc_t thread_func, void *arg)
{
   pthread_t *pth;
   pthread_attr_t pthAttr;

   pth = malloc(sizeof(pthread_t));

   if (pth)
   {
      if (pthread_attr_init(&pthAttr))
      {
         perror("pthread_attr_init failed");
         free(pth);
         return NULL;
      }

      if (pthread_attr_setstacksize(&pthAttr, STACK_SIZE))
      {
         perror("pthread_attr_setstacksize failed");
         free(pth);
         return NULL;
      }

      if (pthread_create(pth, &pthAttr, thread_func, arg))
      {
         perror("pthread_create socket failed");
         free(pth);
         return NULL;
      }
   }
   return pth;
}